

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA5Application.cpp
# Opt level: O2

void __thiscall
PA5Application::RenderObjectPart::RenderObjectPart
          (RenderObjectPart *this,shared_ptr<VAO> *vao,shared_ptr<Program> *program,
          shared_ptr<Texture> *texture,shared_ptr<Texture> *ntexture,shared_ptr<Texture> *stexture)

{
  std::__shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2> *)this,
             &vao->super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>,
             &program->super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_diffuseTexture).super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>,
             &texture->super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_normalTexture).super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>,
             &ntexture->super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_specularTexture).super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>,
             &stexture->super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

PA5Application::RenderObjectPart::RenderObjectPart(std::shared_ptr<VAO> vao, std::shared_ptr<Program> program, std::shared_ptr<Texture> texture, std::shared_ptr<Texture> ntexture,
                                                   std::shared_ptr<Texture> stexture)
    : m_vao(vao), m_program(program), m_diffuseTexture(texture), m_normalTexture(ntexture), m_specularTexture(stexture)
{
}